

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalExport::BuildPipelines
          (PhysicalExport *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  bool bVar1;
  PhysicalOperator *op;
  MetaPipeline *in_RDX;
  PipelineBuildState *in_RSI;
  PipelineBuildState *state;
  MetaPipeline *in_stack_00000040;
  Pipeline *in_stack_00000048;
  PhysicalOperator *in_stack_00000050;
  
  op = (PhysicalOperator *)MetaPipeline::GetState(in_RDX);
  PipelineBuildState::SetPipelineSource(in_RSI,(Pipeline *)in_RDX,op);
  bVar1 = ::std::
          vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ::empty((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   *)in_RSI);
  if (!bVar1) {
    PhysicalOperator::BuildPipelines(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  return;
}

Assistant:

void PhysicalExport::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	// EXPORT has an optional child
	// we only need to schedule child pipelines if there is a child
	auto &state = meta_pipeline.GetState();
	state.SetPipelineSource(current, *this);
	if (children.empty()) {
		return;
	}
	PhysicalOperator::BuildPipelines(current, meta_pipeline);
}